

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# default_secrets.cpp
# Opt level: O2

unique_ptr<duckdb::BaseSecret,_std::default_delete<duckdb::BaseSecret>,_true> __thiscall
duckdb::CreateHTTPSecretFunctions::CreateHTTPSecretFromConfig
          (CreateHTTPSecretFunctions *this,ClientContext *context,CreateSecretInput *input)

{
  pointer pKVar1;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  allocator local_41;
  _Tuple_impl<0UL,_duckdb::KeyValueSecret_*,_std::default_delete<duckdb::KeyValueSecret>_> local_40;
  string local_38;
  
  make_uniq<duckdb::KeyValueSecret,duckdb::vector<std::__cxx11::string,true>&,std::__cxx11::string&,std::__cxx11::string&,std::__cxx11::string&>
            ((duckdb *)&local_40,&input->scope,&input->type,&input->provider,&input->name);
  pKVar1 = unique_ptr<duckdb::KeyValueSecret,_std::default_delete<duckdb::KeyValueSecret>,_true>::
           operator->((unique_ptr<duckdb::KeyValueSecret,_std::default_delete<duckdb::KeyValueSecret>,_true>
                       *)&local_40);
  ::std::__cxx11::string::string((string *)&local_38,"http_proxy",&local_41);
  KeyValueSecret::TrySetValue(pKVar1,&local_38,input);
  ::std::__cxx11::string::~string((string *)&local_38);
  pKVar1 = unique_ptr<duckdb::KeyValueSecret,_std::default_delete<duckdb::KeyValueSecret>,_true>::
           operator->((unique_ptr<duckdb::KeyValueSecret,_std::default_delete<duckdb::KeyValueSecret>,_true>
                       *)&local_40);
  ::std::__cxx11::string::string((string *)&local_38,"http_proxy_password",&local_41);
  KeyValueSecret::TrySetValue(pKVar1,&local_38,input);
  ::std::__cxx11::string::~string((string *)&local_38);
  pKVar1 = unique_ptr<duckdb::KeyValueSecret,_std::default_delete<duckdb::KeyValueSecret>,_true>::
           operator->((unique_ptr<duckdb::KeyValueSecret,_std::default_delete<duckdb::KeyValueSecret>,_true>
                       *)&local_40);
  ::std::__cxx11::string::string((string *)&local_38,"http_proxy_username",&local_41);
  KeyValueSecret::TrySetValue(pKVar1,&local_38,input);
  ::std::__cxx11::string::~string((string *)&local_38);
  pKVar1 = unique_ptr<duckdb::KeyValueSecret,_std::default_delete<duckdb::KeyValueSecret>,_true>::
           operator->((unique_ptr<duckdb::KeyValueSecret,_std::default_delete<duckdb::KeyValueSecret>,_true>
                       *)&local_40);
  ::std::__cxx11::string::string((string *)&local_38,"extra_http_headers",&local_41);
  KeyValueSecret::TrySetValue(pKVar1,&local_38,input);
  ::std::__cxx11::string::~string((string *)&local_38);
  pKVar1 = unique_ptr<duckdb::KeyValueSecret,_std::default_delete<duckdb::KeyValueSecret>,_true>::
           operator->((unique_ptr<duckdb::KeyValueSecret,_std::default_delete<duckdb::KeyValueSecret>,_true>
                       *)&local_40);
  ::std::__cxx11::string::string((string *)&local_38,"bearer_token",&local_41);
  KeyValueSecret::TrySetValue(pKVar1,&local_38,input);
  ::std::__cxx11::string::~string((string *)&local_38);
  ::std::__cxx11::string::string((string *)&local_38,"http_proxy_password",&local_41);
  pKVar1 = unique_ptr<duckdb::KeyValueSecret,_std::default_delete<duckdb::KeyValueSecret>,_true>::
           operator->((unique_ptr<duckdb::KeyValueSecret,_std::default_delete<duckdb::KeyValueSecret>,_true>
                       *)&local_40);
  __l._M_len = 1;
  __l._M_array = &local_38;
  ::std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  ::operator=(&(pKVar1->redact_keys)._M_h,__l);
  ::std::__cxx11::string::~string((string *)&local_38);
  *(_Head_base<0UL,_duckdb::KeyValueSecret_*,_false> *)this =
       local_40.super__Head_base<0UL,_duckdb::KeyValueSecret_*,_false>._M_head_impl;
  return (unique_ptr<duckdb::BaseSecret,_std::default_delete<duckdb::BaseSecret>_>)
         (unique_ptr<duckdb::BaseSecret,_std::default_delete<duckdb::BaseSecret>_>)this;
}

Assistant:

unique_ptr<BaseSecret> CreateHTTPSecretFunctions::CreateHTTPSecretFromConfig(ClientContext &context,
                                                                             CreateSecretInput &input) {
	auto secret = make_uniq<KeyValueSecret>(input.scope, input.type, input.provider, input.name);

	secret->TrySetValue("http_proxy", input);
	secret->TrySetValue("http_proxy_password", input);
	secret->TrySetValue("http_proxy_username", input);

	secret->TrySetValue("extra_http_headers", input);
	secret->TrySetValue("bearer_token", input);

	//! Set redact keys
	secret->redact_keys = {"http_proxy_password"};

	return std::move(secret);
}